

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O1

ssize_t __thiscall zmq::pipe_t::write(pipe_t *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  msg_t *this_00;
  bool bVar4;
  
  this_00 = (msg_t *)CONCAT44(in_register_00000034,__fd);
  uVar3 = 0;
  if (((this->_out_active == true) && (this->_state == active)) &&
     (uVar1 = this->_hwm, bVar4 = this->_msgs_written - this->_peers_msgs_read < (ulong)uVar1,
     uVar3 = (uint)(bVar4 || (int)uVar1 < 1), !bVar4 && (int)uVar1 >= 1)) {
    this->_out_active = false;
    uVar3 = 0;
  }
  if ((char)uVar3 != '\0') {
    bVar2 = msg_t::flags(this_00);
    bVar4 = msg_t::is_routing_id(this_00);
    (*this->_out_pipe->_vptr_ypipe_base_t[2])(this->_out_pipe,this_00,(ulong)(bVar2 & 1));
    if (!bVar4 && (bVar2 & 1) == 0) {
      this->_msgs_written = this->_msgs_written + 1;
    }
  }
  return (ulong)uVar3;
}

Assistant:

bool zmq::pipe_t::write (const msg_t *msg_)
{
    if (unlikely (!check_write ()))
        return false;

    const bool more = (msg_->flags () & msg_t::more) != 0;
    const bool is_routing_id = msg_->is_routing_id ();
    _out_pipe->write (*msg_, more);
    if (!more && !is_routing_id)
        _msgs_written++;

    return true;
}